

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

void __thiscall Snes_Spc::end_frame(Snes_Spc *this,time_t end_time)

{
  uint uVar1;
  int in_ESI;
  long in_RDI;
  Snes_Spc *unaff_retaddr;
  int clock_count;
  int count;
  int i;
  int in_stack_000000fc;
  Spc_Dsp *in_stack_00000100;
  time_t in_stack_000001fc;
  Snes_Spc *in_stack_00000200;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar2;
  
  if (*(int *)(in_RDI + 0x884) < in_ESI) {
    run_until_(in_stack_00000200,in_stack_000001fc);
  }
  *(int *)(in_RDI + 0x884) = *(int *)(in_RDI + 0x884) - in_ESI;
  *(int *)(in_RDI + 0x8a0) = in_ESI + *(int *)(in_RDI + 0x8a0);
  for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
    run_timer((Snes_Spc *)CONCAT44(in_ESI,iVar2),
              (Timer *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
              (rel_time_t)((ulong)in_RDI >> 0x20));
  }
  if ((*(int *)(in_RDI + 0x880) < 0) && (uVar1 = -*(int *)(in_RDI + 0x880) - 0x1d, -1 < (int)uVar1))
  {
    *(uint *)(in_RDI + 0x880) = (uVar1 & 0xffffffe0) + 0x20 + *(int *)(in_RDI + 0x880);
    Spc_Dsp::run(in_stack_00000100,in_stack_000000fc);
  }
  if (*(long *)(in_RDI + 0x8a8) != 0) {
    save_extra(unaff_retaddr);
  }
  return;
}

Assistant:

void Snes_Spc::end_frame( time_t end_time )
{
	// Catch CPU up to as close to end as possible. If final instruction
	// would exceed end, does NOT execute it and leaves m.spc_time < end.
	if ( end_time > m.spc_time )
		run_until_( end_time );
	
	m.spc_time     -= end_time;
	m.extra_clocks += end_time;
	
	// Greatest number of clocks early that emulation can stop early due to
	// not being able to execute current instruction without going over
	// allowed time.
	assert( -cpu_lag_max <= m.spc_time && m.spc_time <= 0 );
	
	// Catch timers up to CPU
	for ( int i = 0; i < timer_count; i++ )
		run_timer( &m.timers [i], 0 );
	
	// Catch DSP up to CPU
	if ( m.dsp_time < 0 )
	{
		RUN_DSP( 0, max_reg_time );
	}
	
	// Save any extra samples beyond what should be generated
	if ( m.buf_begin )
		save_extra();
}